

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

int __thiscall
Centaurus::CATNMachine<char>::import_literal_terminal
          (CATNMachine<char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *literal,int origin,
          int tag)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  CharClass<char> local_50;
  
  sVar2 = literal->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (literal->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      bVar1 = pcVar3[sVar4];
      CharClass<char>::CharClass(&local_50,(uint)bVar1,(uint)bVar1 + L'\x01');
      origin = add_node(this,&local_50,origin,tag);
      local_50._vptr_CharClass = (_func_int **)&PTR__CharClass_00185b88;
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
                (&local_50.m_ranges);
      sVar4 = sVar4 + 1;
      tag = 0;
    } while (sVar2 != sVar4);
  }
  return origin;
}

Assistant:

int import_literal_terminal(const std::basic_string<TCHAR>& literal, int origin, int tag)
    {
        for (TCHAR ch : literal)
        {
            origin = add_node(CharClass<TCHAR>(ch, ch + 1), origin, tag);
            tag = 0;
        }
        return origin;
    }